

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int32 prune_quests(node *sroot,int32 ndesirdnodes)

{
  int32 iVar1;
  void *ptr;
  int *ptr_00;
  float *ptr_01;
  node **local_58;
  node **idlist;
  int32 maxid;
  int32 i;
  int32 nnodes;
  int32 ntwigs;
  int32 *twiglist;
  int32 nleaves;
  int32 nquests;
  int32 *leaflist;
  float32 maxdec;
  float32 *twiglkhddec;
  int32 ndesirdnodes_local;
  node *sroot_local;
  
  local_58 = (node **)__ckd_calloc__(0x400,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                     ,0x250);
  iVar1 = id_nodes(sroot,local_58,0);
  ptr = __ckd_calloc__((long)iVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x255);
  ptr_00 = (int *)__ckd_calloc__((long)iVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x256);
  ptr_01 = (float *)__ckd_calloc__((long)iVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,599);
  twiglist._4_4_ = 0;
  i = 0;
  twiglist._0_4_ = 0;
  for (idlist._4_4_ = 0; idlist._4_4_ < iVar1; idlist._4_4_ = idlist._4_4_ + 1) {
    if ((0 < local_58[idlist._4_4_]->depth) &&
       ((1 < local_58[idlist._4_4_]->nphones || (local_58[idlist._4_4_]->depth < 4)))) {
      twiglist._4_4_ = twiglist._4_4_ + 1;
    }
    if (((local_58[idlist._4_4_] == (node *)0x0) ||
        (local_58[idlist._4_4_]->left != (node_str *)0x0)) ||
       (local_58[idlist._4_4_]->right != (node_str *)0x0)) {
      if ((((local_58[idlist._4_4_] != (node *)0x0) &&
           (local_58[idlist._4_4_]->left != (node_str *)0x0)) &&
          ((local_58[idlist._4_4_]->left->left == (node_str *)0x0 &&
           ((local_58[idlist._4_4_]->left->right == (node_str *)0x0 &&
            (local_58[idlist._4_4_]->right != (node_str *)0x0)))))) &&
         ((local_58[idlist._4_4_]->right->left == (node_str *)0x0 &&
          (local_58[idlist._4_4_]->right->right == (node_str *)0x0)))) {
        ptr_00[i] = idlist._4_4_;
        ptr_01[i] = (float)local_58[idlist._4_4_]->lkhd_dec;
        i = i + 1;
      }
    }
    else {
      *(int *)((long)ptr + (long)(int)twiglist * 4) = idlist._4_4_;
      twiglist._0_4_ = (int)twiglist + 1;
    }
  }
  while (ndesirdnodes + 1 < twiglist._4_4_) {
    leaflist._4_4_ = *ptr_01;
    idlist._0_4_ = *ptr_00;
    for (idlist._4_4_ = 1; idlist._4_4_ < i; idlist._4_4_ = idlist._4_4_ + 1) {
      if (leaflist._4_4_ < ptr_01[idlist._4_4_]) {
        leaflist._4_4_ = ptr_01[idlist._4_4_];
        idlist._0_4_ = ptr_00[idlist._4_4_];
      }
    }
    free_tree(local_58[(int)idlist]->left);
    free_tree(local_58[(int)idlist]->right);
    local_58[(int)idlist]->right = (node_str *)0x0;
    local_58[(int)idlist]->left = (node_str *)0x0;
    ckd_free(local_58);
    local_58 = (node **)__ckd_calloc__(0x400,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                       ,0x272);
    iVar1 = id_nodes(sroot,local_58,0);
    twiglist._4_4_ = 0;
    i = 0;
    twiglist._0_4_ = 0;
    for (idlist._4_4_ = 0; idlist._4_4_ < iVar1; idlist._4_4_ = idlist._4_4_ + 1) {
      if ((0 < local_58[idlist._4_4_]->depth) &&
         ((1 < local_58[idlist._4_4_]->nphones || (local_58[idlist._4_4_]->depth < 4)))) {
        twiglist._4_4_ = twiglist._4_4_ + 1;
      }
      if (((local_58[idlist._4_4_] == (node *)0x0) ||
          (local_58[idlist._4_4_]->left != (node_str *)0x0)) ||
         (local_58[idlist._4_4_]->right != (node_str *)0x0)) {
        if ((((local_58[idlist._4_4_] != (node *)0x0) &&
             (local_58[idlist._4_4_]->left != (node_str *)0x0)) &&
            (((local_58[idlist._4_4_]->left->left == (node_str *)0x0 &&
              ((local_58[idlist._4_4_]->left->right == (node_str *)0x0 &&
               (local_58[idlist._4_4_]->right != (node_str *)0x0)))) &&
             (local_58[idlist._4_4_]->right->left == (node_str *)0x0)))) &&
           (local_58[idlist._4_4_]->right->right == (node_str *)0x0)) {
          ptr_00[i] = idlist._4_4_;
          ptr_01[i] = (float)local_58[idlist._4_4_]->lkhd_dec;
          i = i + 1;
        }
      }
      else {
        *(int *)((long)ptr + (long)(int)twiglist * 4) = idlist._4_4_;
        twiglist._0_4_ = (int)twiglist + 1;
      }
    }
  }
  ckd_free(local_58);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(ptr_01);
  return twiglist._4_4_;
}

Assistant:

int32 prune_quests(node *sroot, int32 ndesirdnodes)
{
    float32 *twiglkhddec,maxdec;
    int32  *leaflist, nquests, nleaves, *twiglist, ntwigs;
    int32  nnodes,i,maxid;
    node   **idlist;

    /* Ignore root node == preincrement ndesirdnodes */
    ndesirdnodes++;
    /* Overallocate idlist */
    idlist = (node **) ckd_calloc(1024,sizeof(node *));
    /* First "id" all the nodes */
    nnodes = id_nodes(sroot,idlist,0);

    /* Allocate lists (overallocate for safety margin) */
    leaflist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglkhddec = (float32 *) ckd_calloc(nnodes,sizeof(float32));

    nleaves = ntwigs = nquests = 0;
    for(i=0;i<nnodes;i++) {
        if (IS_QUEST(idlist[i])) nquests++;
        if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
        else if (IS_TWIG(idlist[i])) {
            twiglist[ntwigs] = i;
            twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
        }
    }

    while (nquests > ndesirdnodes) {
        /* find twig for which likelihood decerase was maximum */
        maxdec = twiglkhddec[0]; maxid = twiglist[0];
        for (i=1; i<ntwigs;i++) {
            if (twiglkhddec[i] > maxdec) {
                maxdec = twiglkhddec[i];
                maxid = twiglist[i];
            }
        }
        /* remove children of twig, make twig a leaf, eliminate it from
           the node list, and continue */
        free_tree(idlist[maxid]->left); free_tree(idlist[maxid]->right);
        idlist[maxid]->left = idlist[maxid]->right = NULL;

        ckd_free(idlist);
        idlist = (node **) ckd_calloc(1024,sizeof(node *));
        nnodes = id_nodes(sroot,idlist,0);
        nleaves = ntwigs = nquests = 0;
        for(i=0;i<nnodes;i++) {
            if (IS_QUEST(idlist[i])) nquests++;
            if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
            else if (IS_TWIG(idlist[i])) {
                twiglist[ntwigs] = i;
                twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
            }
        }
    }
    ckd_free(idlist); ckd_free(leaflist);
    ckd_free(twiglist); ckd_free(twiglkhddec);

    return(nquests);
}